

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O1

void iadst8_w4_sse2(__m128i *input,__m128i *output)

{
  __m128i alVar1;
  __m128i _in0;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar17 [16];
  __m128i _in1_3;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  __m128i _in0_1;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  __m128i alVar37;
  __m128i _in0_2;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  __m128i alVar41;
  undefined1 auVar42 [16];
  undefined1 auVar46 [16];
  undefined1 auVar50 [16];
  __m128i _in1_1;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  __m128i alVar58;
  __m128i _in1_2;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  __m128i _in1;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar9 [16];
  undefined1 auVar14 [16];
  undefined1 auVar10 [16];
  undefined1 auVar15 [16];
  undefined1 auVar11 [16];
  undefined1 auVar16 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  
  alVar1 = input[1];
  alVar37 = input[3];
  alVar41 = input[5];
  alVar58 = input[7];
  auVar49._0_12_ = alVar58._0_12_;
  auVar49._12_2_ = alVar58[0]._6_2_;
  auVar49._14_2_ = *(undefined2 *)((long)*input + 6);
  auVar48._12_4_ = auVar49._12_4_;
  auVar48._0_10_ = alVar58._0_10_;
  auVar48._10_2_ = *(undefined2 *)((long)*input + 4);
  auVar47._10_6_ = auVar48._10_6_;
  auVar47._0_8_ = alVar58[0];
  auVar47._8_2_ = alVar58[0]._4_2_;
  auVar46._8_8_ = auVar47._8_8_;
  auVar46._6_2_ = *(undefined2 *)((long)*input + 2);
  auVar46._4_2_ = alVar58[0]._2_2_;
  auVar46._0_2_ = (undefined2)alVar58[0];
  auVar46._2_2_ = (short)(*input)[0];
  auVar45._0_12_ = alVar41._0_12_;
  auVar45._12_2_ = alVar41[0]._6_2_;
  auVar45._14_2_ = *(undefined2 *)((long)input[2] + 6);
  auVar44._12_4_ = auVar45._12_4_;
  auVar44._0_10_ = alVar41._0_10_;
  auVar44._10_2_ = *(undefined2 *)((long)input[2] + 4);
  auVar43._10_6_ = auVar44._10_6_;
  auVar43._0_8_ = alVar41[0];
  auVar43._8_2_ = alVar41[0]._4_2_;
  auVar42._8_8_ = auVar43._8_8_;
  auVar42._6_2_ = *(undefined2 *)((long)input[2] + 2);
  auVar42._4_2_ = alVar41[0]._2_2_;
  auVar42._0_2_ = (undefined2)alVar41[0];
  auVar42._2_2_ = (short)input[2][0];
  auVar34._0_12_ = alVar37._0_12_;
  auVar34._12_2_ = alVar37[0]._6_2_;
  auVar34._14_2_ = *(undefined2 *)((long)input[4] + 6);
  auVar33._12_4_ = auVar34._12_4_;
  auVar33._0_10_ = alVar37._0_10_;
  auVar33._10_2_ = *(undefined2 *)((long)input[4] + 4);
  auVar32._10_6_ = auVar33._10_6_;
  auVar32._0_8_ = alVar37[0];
  auVar32._8_2_ = alVar37[0]._4_2_;
  auVar31._8_8_ = auVar32._8_8_;
  auVar31._6_2_ = *(undefined2 *)((long)input[4] + 2);
  auVar31._4_2_ = alVar37[0]._2_2_;
  auVar31._0_2_ = (undefined2)alVar37[0];
  auVar31._2_2_ = (short)input[4][0];
  auVar5._0_12_ = alVar1._0_12_;
  auVar5._12_2_ = alVar1[0]._6_2_;
  auVar5._14_2_ = *(undefined2 *)((long)input[6] + 6);
  auVar7._12_4_ = auVar5._12_4_;
  auVar7._0_10_ = alVar1._0_10_;
  auVar7._10_2_ = *(undefined2 *)((long)input[6] + 4);
  auVar2._10_6_ = auVar7._10_6_;
  auVar2._0_8_ = alVar1[0];
  auVar2._8_2_ = alVar1[0]._4_2_;
  auVar3._8_8_ = auVar2._8_8_;
  auVar3._6_2_ = *(undefined2 *)((long)input[6] + 2);
  auVar3._4_2_ = alVar1[0]._2_2_;
  auVar3._0_2_ = (undefined2)alVar1[0];
  auVar3._2_2_ = (short)input[6][0];
  auVar4._8_4_ = 0x1910fec;
  auVar4._0_8_ = 0x1910fec01910fec;
  auVar4._12_4_ = 0x1910fec;
  auVar5 = pmaddwd(auVar4,auVar46);
  auVar65._8_4_ = 0xf0140191;
  auVar65._0_8_ = 0xf0140191f0140191;
  auVar65._12_4_ = 0xf0140191;
  auVar2 = pmaddwd(auVar65,auVar46);
  auVar18._8_4_ = 0x78b0e1c;
  auVar18._0_8_ = 0x78b0e1c078b0e1c;
  auVar18._12_4_ = 0x78b0e1c;
  auVar19 = pmaddwd(auVar18,auVar42);
  auVar27._8_4_ = 0xf1e4078b;
  auVar27._0_8_ = 0xf1e4078bf1e4078b;
  auVar27._12_4_ = 0xf1e4078b;
  auVar28 = pmaddwd(auVar27,auVar42);
  auVar38._8_4_ = 0xc5e0a26;
  auVar38._0_8_ = 0xc5e0a260c5e0a26;
  auVar38._12_4_ = 0xc5e0a26;
  auVar39 = pmaddwd(auVar38,auVar31);
  auVar62._8_4_ = 0xf5da0c5e;
  auVar62._0_8_ = 0xf5da0c5ef5da0c5e;
  auVar62._12_4_ = 0xf5da0c5e;
  auVar63 = pmaddwd(auVar62,auVar31);
  auVar6._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar6._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar6._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar6._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar61._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar61._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar61._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar61._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar7 = packssdw(auVar6,auVar6);
  auVar5 = packssdw(auVar61,auVar61);
  auVar40._0_4_ = auVar39._0_4_ + 0x800 >> 0xc;
  auVar40._4_4_ = auVar39._4_4_ + 0x800 >> 0xc;
  auVar40._8_4_ = auVar39._8_4_ + 0x800 >> 0xc;
  auVar40._12_4_ = auVar39._12_4_ + 0x800 >> 0xc;
  auVar64._0_4_ = auVar63._0_4_ + 0x800 >> 0xc;
  auVar64._4_4_ = auVar63._4_4_ + 0x800 >> 0xc;
  auVar64._8_4_ = auVar63._8_4_ + 0x800 >> 0xc;
  auVar64._12_4_ = auVar63._12_4_ + 0x800 >> 0xc;
  auVar63 = packssdw(auVar40,auVar40);
  auVar65 = packssdw(auVar64,auVar64);
  auVar35._8_4_ = 0xf5004a5;
  auVar35._0_8_ = 0xf5004a50f5004a5;
  auVar35._12_4_ = 0xf5004a5;
  auVar39 = pmaddwd(auVar35,auVar3);
  auVar51._8_4_ = 0xfb5b0f50;
  auVar51._0_8_ = 0xfb5b0f50fb5b0f50;
  auVar51._12_4_ = 0xfb5b0f50;
  auVar52 = pmaddwd(auVar51,auVar3);
  auVar2 = paddsw(auVar7,auVar63);
  auVar7 = psubsw(auVar7,auVar63);
  auVar63 = paddsw(auVar5,auVar65);
  auVar3 = psubsw(auVar5,auVar65);
  auVar20._0_4_ = auVar19._0_4_ + 0x800 >> 0xc;
  auVar20._4_4_ = auVar19._4_4_ + 0x800 >> 0xc;
  auVar20._8_4_ = auVar19._8_4_ + 0x800 >> 0xc;
  auVar20._12_4_ = auVar19._12_4_ + 0x800 >> 0xc;
  auVar29._0_4_ = auVar28._0_4_ + 0x800 >> 0xc;
  auVar29._4_4_ = auVar28._4_4_ + 0x800 >> 0xc;
  auVar29._8_4_ = auVar28._8_4_ + 0x800 >> 0xc;
  auVar29._12_4_ = auVar28._12_4_ + 0x800 >> 0xc;
  auVar5 = packssdw(auVar20,auVar20);
  auVar19 = packssdw(auVar29,auVar29);
  auVar36._0_4_ = auVar39._0_4_ + 0x800 >> 0xc;
  auVar36._4_4_ = auVar39._4_4_ + 0x800 >> 0xc;
  auVar36._8_4_ = auVar39._8_4_ + 0x800 >> 0xc;
  auVar36._12_4_ = auVar39._12_4_ + 0x800 >> 0xc;
  auVar53._0_4_ = auVar52._0_4_ + 0x800 >> 0xc;
  auVar53._4_4_ = auVar52._4_4_ + 0x800 >> 0xc;
  auVar53._8_4_ = auVar52._8_4_ + 0x800 >> 0xc;
  auVar53._12_4_ = auVar52._12_4_ + 0x800 >> 0xc;
  auVar28 = packssdw(auVar36,auVar36);
  auVar39 = packssdw(auVar53,auVar53);
  auVar11._0_12_ = auVar7._0_12_;
  auVar11._12_2_ = auVar7._6_2_;
  auVar11._14_2_ = auVar3._6_2_;
  auVar10._12_4_ = auVar11._12_4_;
  auVar10._0_10_ = auVar7._0_10_;
  auVar10._10_2_ = auVar3._4_2_;
  auVar9._10_6_ = auVar10._10_6_;
  auVar9._0_8_ = auVar7._0_8_;
  auVar9._8_2_ = auVar7._4_2_;
  auVar8._8_8_ = auVar9._8_8_;
  auVar8._6_2_ = auVar3._2_2_;
  auVar8._4_2_ = auVar7._2_2_;
  auVar8._0_2_ = auVar7._0_2_;
  auVar8._2_2_ = auVar3._0_2_;
  auVar3 = paddsw(auVar5,auVar28);
  auVar5 = psubsw(auVar5,auVar28);
  auVar28 = paddsw(auVar19,auVar39);
  auVar7 = psubsw(auVar19,auVar39);
  auVar24._0_12_ = auVar5._0_12_;
  auVar24._12_2_ = auVar5._6_2_;
  auVar24._14_2_ = auVar7._6_2_;
  auVar23._12_4_ = auVar24._12_4_;
  auVar23._0_10_ = auVar5._0_10_;
  auVar23._10_2_ = auVar7._4_2_;
  auVar22._10_6_ = auVar23._10_6_;
  auVar22._0_8_ = auVar5._0_8_;
  auVar22._8_2_ = auVar5._4_2_;
  auVar21._8_8_ = auVar22._8_8_;
  auVar21._6_2_ = auVar7._2_2_;
  auVar21._4_2_ = auVar5._2_2_;
  auVar21._0_2_ = auVar5._0_2_;
  auVar21._2_2_ = auVar7._0_2_;
  auVar30._8_4_ = 0x61f0ec8;
  auVar30._0_8_ = 0x61f0ec8061f0ec8;
  auVar30._12_4_ = 0x61f0ec8;
  auVar54._8_4_ = 0xf138061f;
  auVar54._0_8_ = 0xf138061ff138061f;
  auVar54._12_4_ = 0xf138061f;
  auVar19 = pmaddwd(auVar54,auVar8);
  auVar5 = pmaddwd(auVar8,auVar30);
  auVar59._8_4_ = 0xec8f9e1;
  auVar59._0_8_ = 0xec8f9e10ec8f9e1;
  auVar59._12_4_ = 0xec8f9e1;
  auVar39 = pmaddwd(auVar59,auVar21);
  auVar7 = pmaddwd(auVar21,auVar30);
  alVar37 = (__m128i)paddsw(auVar2,auVar3);
  auVar2 = psubsw(auVar2,auVar3);
  auVar65 = paddsw(auVar63,auVar28);
  auVar3 = psubsw(auVar63,auVar28);
  auVar12._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar12._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar12._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar12._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar55._0_4_ = auVar19._0_4_ + 0x800 >> 0xc;
  auVar55._4_4_ = auVar19._4_4_ + 0x800 >> 0xc;
  auVar55._8_4_ = auVar19._8_4_ + 0x800 >> 0xc;
  auVar55._12_4_ = auVar19._12_4_ + 0x800 >> 0xc;
  auVar5 = packssdw(auVar12,auVar12);
  auVar52 = packssdw(auVar55,auVar55);
  auVar60._0_4_ = auVar39._0_4_ + 0x800 >> 0xc;
  auVar60._4_4_ = auVar39._4_4_ + 0x800 >> 0xc;
  auVar60._8_4_ = auVar39._8_4_ + 0x800 >> 0xc;
  auVar60._12_4_ = auVar39._12_4_ + 0x800 >> 0xc;
  auVar25._0_4_ = auVar7._0_4_ + 0x800 >> 0xc;
  auVar25._4_4_ = auVar7._4_4_ + 0x800 >> 0xc;
  auVar25._8_4_ = auVar7._8_4_ + 0x800 >> 0xc;
  auVar25._12_4_ = auVar7._12_4_ + 0x800 >> 0xc;
  auVar61 = packssdw(auVar60,auVar60);
  auVar7 = packssdw(auVar25,auVar25);
  auVar63._0_12_ = auVar2._0_12_;
  auVar63._12_2_ = auVar2._6_2_;
  auVar63._14_2_ = auVar3._6_2_;
  auVar39._12_4_ = auVar63._12_4_;
  auVar39._0_10_ = auVar2._0_10_;
  auVar39._10_2_ = auVar3._4_2_;
  auVar28._10_6_ = auVar39._10_6_;
  auVar28._0_8_ = auVar2._0_8_;
  auVar28._8_2_ = auVar2._4_2_;
  auVar19._8_8_ = auVar28._8_8_;
  auVar19._6_2_ = auVar3._2_2_;
  auVar19._4_2_ = auVar2._2_2_;
  auVar19._0_2_ = auVar2._0_2_;
  auVar19._2_2_ = auVar3._0_2_;
  auVar3 = paddsw(auVar5,auVar61);
  auVar2 = psubsw(auVar5,auVar61);
  alVar41 = (__m128i)paddsw(auVar52,auVar7);
  auVar5 = psubsw(auVar52,auVar7);
  auVar16._0_12_ = auVar2._0_12_;
  auVar16._12_2_ = auVar2._6_2_;
  auVar16._14_2_ = auVar5._6_2_;
  auVar15._12_4_ = auVar16._12_4_;
  auVar15._0_10_ = auVar2._0_10_;
  auVar15._10_2_ = auVar5._4_2_;
  auVar14._10_6_ = auVar15._10_6_;
  auVar14._0_8_ = auVar2._0_8_;
  auVar14._8_2_ = auVar2._4_2_;
  auVar13._8_8_ = auVar14._8_8_;
  auVar13._6_2_ = auVar5._2_2_;
  auVar13._4_2_ = auVar2._2_2_;
  auVar13._0_2_ = auVar2._0_2_;
  auVar13._2_2_ = auVar5._0_2_;
  auVar56._8_4_ = 0xb500b50;
  auVar56._0_8_ = 0xb500b500b500b50;
  auVar56._12_4_ = 0xb500b50;
  auVar5 = pmaddwd(auVar19,auVar56);
  auVar50._8_4_ = 0xf4b00b50;
  auVar50._0_8_ = 0xf4b00b50f4b00b50;
  auVar50._12_4_ = 0xf4b00b50;
  auVar2 = pmaddwd(auVar19,auVar50);
  auVar26._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar26._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar26._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar26._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar52._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar52._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar52._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar52._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar5 = packssdw(auVar26,auVar26);
  alVar1 = (__m128i)packssdw(auVar52,auVar52);
  auVar7 = pmaddwd(auVar56,auVar13);
  auVar2 = pmaddwd(auVar13,auVar50);
  auVar57._0_4_ = auVar7._0_4_ + 0x800 >> 0xc;
  auVar57._4_4_ = auVar7._4_4_ + 0x800 >> 0xc;
  auVar57._8_4_ = auVar7._8_4_ + 0x800 >> 0xc;
  auVar57._12_4_ = auVar7._12_4_ + 0x800 >> 0xc;
  auVar17._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar17._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar17._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar17._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  alVar58 = (__m128i)packssdw(auVar57,auVar57);
  auVar2 = packssdw(auVar17,auVar17);
  *output = alVar37;
  alVar37 = (__m128i)psubsw((undefined1  [16])0x0,auVar3);
  output[1] = alVar37;
  output[2] = alVar58;
  alVar37 = (__m128i)psubsw((undefined1  [16])0x0,auVar5);
  output[3] = alVar37;
  output[4] = alVar1;
  alVar1 = (__m128i)psubsw((undefined1  [16])0x0,auVar2);
  output[5] = alVar1;
  output[6] = alVar41;
  alVar1 = (__m128i)psubsw((undefined1  [16])0x0,auVar65);
  output[7] = alVar1;
  return;
}

Assistant:

static void iadst8_w4_sse2(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __zero = _mm_setzero_si128();
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p04_p60 = pair_set_epi16(cospi[4], cospi[60]);
  const __m128i cospi_p60_m04 = pair_set_epi16(cospi[60], -cospi[4]);
  const __m128i cospi_p20_p44 = pair_set_epi16(cospi[20], cospi[44]);
  const __m128i cospi_p44_m20 = pair_set_epi16(cospi[44], -cospi[20]);
  const __m128i cospi_p36_p28 = pair_set_epi16(cospi[36], cospi[28]);
  const __m128i cospi_p28_m36 = pair_set_epi16(cospi[28], -cospi[36]);
  const __m128i cospi_p52_p12 = pair_set_epi16(cospi[52], cospi[12]);
  const __m128i cospi_p12_m52 = pair_set_epi16(cospi[12], -cospi[52]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_m48_p16 = pair_set_epi16(-cospi[48], cospi[16]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);

  // stage 1
  __m128i x[8];
  x[0] = input[7];
  x[1] = input[0];
  x[2] = input[5];
  x[3] = input[2];
  x[4] = input[3];
  x[5] = input[4];
  x[6] = input[1];
  x[7] = input[6];

  // stage 2
  btf_16_4p_sse2(cospi_p04_p60, cospi_p60_m04, x[0], x[1], x[0], x[1]);
  btf_16_4p_sse2(cospi_p20_p44, cospi_p44_m20, x[2], x[3], x[2], x[3]);
  btf_16_4p_sse2(cospi_p36_p28, cospi_p28_m36, x[4], x[5], x[4], x[5]);
  btf_16_4p_sse2(cospi_p52_p12, cospi_p12_m52, x[6], x[7], x[6], x[7]);

  // stage 3
  btf_16_adds_subs_sse2(x[0], x[4]);
  btf_16_adds_subs_sse2(x[1], x[5]);
  btf_16_adds_subs_sse2(x[2], x[6]);
  btf_16_adds_subs_sse2(x[3], x[7]);

  // stage 4
  btf_16_4p_sse2(cospi_p16_p48, cospi_p48_m16, x[4], x[5], x[4], x[5]);
  btf_16_4p_sse2(cospi_m48_p16, cospi_p16_p48, x[6], x[7], x[6], x[7]);

  // stage 5
  btf_16_adds_subs_sse2(x[0], x[2]);
  btf_16_adds_subs_sse2(x[1], x[3]);
  btf_16_adds_subs_sse2(x[4], x[6]);
  btf_16_adds_subs_sse2(x[5], x[7]);

  // stage 6
  btf_16_4p_sse2(cospi_p32_p32, cospi_p32_m32, x[2], x[3], x[2], x[3]);
  btf_16_4p_sse2(cospi_p32_p32, cospi_p32_m32, x[6], x[7], x[6], x[7]);

  // stage 7
  output[0] = x[0];
  output[1] = _mm_subs_epi16(__zero, x[4]);
  output[2] = x[6];
  output[3] = _mm_subs_epi16(__zero, x[2]);
  output[4] = x[3];
  output[5] = _mm_subs_epi16(__zero, x[7]);
  output[6] = x[5];
  output[7] = _mm_subs_epi16(__zero, x[1]);
}